

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O0

bool __thiscall PolicyPureVector::Increment(PolicyPureVector *this)

{
  int iVar1;
  PolicyDomainCategory PVar2;
  Interface_ProblemToPolicyDiscretePure *pIVar3;
  undefined4 extraout_var;
  reference pvVar4;
  PolicyDiscrete *in_RDI;
  bool bVar5;
  Index i;
  size_t nrOH;
  size_t nrA;
  bool carry_over;
  undefined4 in_stack_ffffffffffffffb8;
  value_type in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar6;
  int local_24;
  
  bVar5 = true;
  pIVar3 = PolicyDiscretePure::GetInterfacePTPDiscretePure
                     ((PolicyDiscretePure *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar1 = (*(pIVar3->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[4])(pIVar3,(ulong)*(uint *)&in_RDI->field_0x34);
  pIVar3 = PolicyDiscretePure::GetInterfacePTPDiscretePure
                     ((PolicyDiscretePure *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar6 = *(uint *)&in_RDI->field_0x34;
  PVar2 = PolicyDiscrete::GetPolicyDomainCategory(in_RDI);
  Policy::GetDepth(&in_RDI->super_Policy);
  local_24 = (*(pIVar3->super_Interface_ProblemToPolicyDiscrete).
               _vptr_Interface_ProblemToPolicyDiscrete[5])(pIVar3,(ulong)uVar6,(ulong)PVar2);
  do {
    local_24 = local_24 + -1;
    if (!bVar5) {
      return false;
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffbc = (value_type)((ulong)(*pvVar4 + 1) % CONCAT44(extraout_var,iVar1));
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    *pvVar4 = in_stack_ffffffffffffffbc;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar5 = *pvVar4 == 0;
  } while (local_24 != 0);
  return bVar5;
}

Assistant:

bool PolicyPureVector::Increment()
{
    bool carry_over = true;
    size_t nrA = GetInterfacePTPDiscretePure()->GetNrActions(_m_agentI);
    size_t nrOH = GetInterfacePTPDiscretePure()->
        GetNrPolicyDomainElements(_m_agentI, GetPolicyDomainCategory(),
                                  GetDepth());

    //i is an integer index counting from nrObservationHistories-1 (=the last
    // observation history) to 0
    //(corresponding to the first (empty) observation sequence.
    Index i = nrOH - 1;
    while(carry_over)
    {
        _m_domainToActionIndices.at(i) = (_m_domainToActionIndices.at(i) + 1) % nrA;
        carry_over = (_m_domainToActionIndices.at(i) == 0);
        if(i > 0)
            i--;
        else
            break;
    }
    return(carry_over);
}